

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_pixel_ops.cpp
# Opt level: O0

bool dxil_spv::emit_derivative_instruction(Op opcode,Impl *impl,CallInst *instruction)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  TypeID TVar4;
  Id type_id;
  Id arg;
  Builder *pBVar5;
  Type *pTVar6;
  Value *pVVar7;
  Operation *pOVar8;
  Operation *cast_op_1;
  Operation *cast_op;
  Operation *pOStack_40;
  Id fp32_type;
  Operation *op;
  bool fp32;
  Id input_id;
  bool relax_precision;
  Id constant_0;
  Builder *builder;
  CallInst *instruction_local;
  Impl *impl_local;
  Op opcode_local;
  
  pBVar5 = Converter::Impl::builder(impl);
  if (((impl->execution_mode_meta).synthesize_dummy_derivatives & 1U) == 0) {
    if ((impl->execution_model == ExecutionModelFragment) ||
       (((impl->options).compute_shader_derivatives & 1U) != 0)) {
      bVar1 = false;
      pTVar6 = LLVMBC::Value::getType((Value *)instruction);
      TVar4 = LLVMBC::Type::getTypeID(pTVar6);
      bVar2 = TVar4 == FloatTyID;
      pTVar6 = LLVMBC::Value::getType((Value *)instruction);
      TVar4 = LLVMBC::Type::getTypeID(pTVar6);
      if ((TVar4 == HalfTyID) &&
         (bVar3 = Converter::Impl::support_native_fp16_operations(impl), !bVar3)) {
        bVar2 = true;
        bVar1 = true;
      }
      if (bVar2) {
        pOStack_40 = Converter::Impl::allocate(impl,opcode,(Value *)instruction);
        pVVar7 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
        op._4_4_ = Converter::Impl::get_id_for_value(impl,pVVar7,0);
      }
      else {
        type_id = spv::Builder::makeFloatType(pBVar5,0x20);
        pOVar8 = Converter::Impl::allocate(impl,OpFConvert,type_id);
        pVVar7 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
        arg = Converter::Impl::get_id_for_value(impl,pVVar7,0);
        Operation::add_id(pOVar8,arg);
        Converter::Impl::add(impl,pOVar8,false);
        op._4_4_ = pOVar8->id;
        pOStack_40 = Converter::Impl::allocate(impl,opcode,type_id);
      }
      Operation::add_id(pOStack_40,op._4_4_);
      Converter::Impl::add(impl,pOStack_40,false);
      if (bVar1) {
        pTVar6 = LLVMBC::Value::getType((Value *)instruction);
        Converter::Impl::decorate_relaxed_precision(impl,pTVar6,pOStack_40->id,false);
      }
      if (!bVar2) {
        pOVar8 = Converter::Impl::allocate(impl,OpFConvert,(Value *)instruction);
        Operation::add_id(pOVar8,pOStack_40->id);
        Converter::Impl::add(impl,pOVar8,false);
      }
      pBVar5 = Converter::Impl::builder(impl);
      spv::Builder::addCapability(pBVar5,CapabilityDerivativeControl);
      impl_local._7_1_ = true;
    }
    else {
      impl_local._7_1_ = emit_derivative_instruction_quad(opcode,impl,instruction);
    }
  }
  else {
    pTVar6 = LLVMBC::Value::getType((Value *)instruction);
    TVar4 = LLVMBC::Type::getTypeID(pTVar6);
    if ((TVar4 == HalfTyID) &&
       (bVar2 = Converter::Impl::support_native_fp16_operations(impl), bVar2)) {
      input_id = spv::Builder::makeFloat16Constant(pBVar5,0,false);
    }
    else {
      input_id = spv::Builder::makeFloatConstant(pBVar5,0.0,false);
    }
    Converter::Impl::rewrite_value(impl,(Value *)instruction,input_id);
    impl_local._7_1_ = true;
  }
  return impl_local._7_1_;
}

Assistant:

bool emit_derivative_instruction(spv::Op opcode, Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	if (impl.execution_mode_meta.synthesize_dummy_derivatives)
	{
		spv::Id constant_0;
		if (instruction->getType()->getTypeID() == llvm::Type::TypeID::HalfTyID &&
		    impl.support_native_fp16_operations())
		{
			constant_0 = builder.makeFloat16Constant(0);
		}
		else
		{
			constant_0 = builder.makeFloatConstant(0.0f);
		}

		impl.rewrite_value(instruction, constant_0);
		return true;
	}

	if (impl.execution_model != spv::ExecutionModelFragment &&
	    !impl.options.compute_shader_derivatives)
	{
		return emit_derivative_instruction_quad(opcode, impl, instruction);
	}

	bool relax_precision = false;
	spv::Id input_id;

	// SPIR-V only supports 32-bit derivatives.
	bool fp32 = instruction->getType()->getTypeID() == llvm::Type::TypeID::FloatTyID;

	if (instruction->getType()->getTypeID() == llvm::Type::TypeID::HalfTyID &&
	    !impl.support_native_fp16_operations())
	{
		fp32 = true;
		relax_precision = true;
	}

	Operation *op;
	if (fp32)
	{
		op = impl.allocate(opcode, instruction);
		// Somewhat redundant, but avoid changing reference output
		// for all shaders that use derivatives with constants.
		input_id = impl.get_id_for_value(instruction->getOperand(1));
	}
	else
	{
		spv::Id fp32_type = builder.makeFloatType(32);
		auto *cast_op = impl.allocate(spv::OpFConvert, fp32_type);
		cast_op->add_id(impl.get_id_for_value(instruction->getOperand(1)));
		impl.add(cast_op);
		input_id = cast_op->id;

		op = impl.allocate(opcode, fp32_type);
	}

	op->add_id(input_id);
	impl.add(op);

	if (relax_precision)
		impl.decorate_relaxed_precision(instruction->getType(), op->id, false);

	if (!fp32)
	{
		auto *cast_op = impl.allocate(spv::OpFConvert, instruction);
		cast_op->add_id(op->id);
		impl.add(cast_op);
	}

	impl.builder().addCapability(spv::CapabilityDerivativeControl);
	return true;
}